

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  xmlParserCtxtPtr pxVar4;
  uint uVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int l;
  xmlParserCtxtPtr local_40;
  uint local_34;
  
  xVar2 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar3 = ctxt->input;
    if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar5 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar5 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar7 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
  local_34 = uVar5;
  uVar5 = xmlCurrentChar(ctxt,&l);
  iVar12 = 100;
  iVar9 = 0;
  iVar11 = 0;
  local_40 = ctxt;
  do {
    pxVar4 = local_40;
    if ((int)uVar5 < 0x100) {
      if ((((int)uVar5 < 0x20) &&
          ((uVar10 = uVar5, 0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0)))) ||
         (uVar10 = local_34, uVar5 == local_34)) {
        pxVar7[iVar9] = '\0';
        local_40->instate = xVar2;
        if (((int)uVar10 < 0x20) && ((0xd < uVar10 || ((0x2600U >> (uVar10 & 0x1f) & 1) == 0))))
        goto LAB_0015b6ba;
        goto LAB_0015b6f7;
      }
    }
    else if ((uVar5 == local_34) ||
            ((uVar5 - 0xfffe < 0xffffe002 && uVar5 - 0x110000 < 0xfff00000) && 0xd7ff < uVar5)) {
      pxVar7[iVar9] = '\0';
      local_40->instate = xVar2;
      if (0xfffff < uVar5 - 0x10000 && (0x1ffd < uVar5 - 0xe000 && 0xd7ff < uVar5)) {
LAB_0015b6ba:
        xmlFatalErr(local_40,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
        return pxVar7;
      }
LAB_0015b6f7:
      xmlNextChar(local_40);
      return pxVar7;
    }
    pxVar8 = pxVar7;
    if (iVar12 <= iVar9 + 5) {
      if ((50000 < iVar12) && ((local_40->options & 0x80000) == 0)) {
        xmlFatalErr(local_40,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(pxVar7);
        pxVar4->instate = xVar2;
        return (xmlChar *)0x0;
      }
      iVar12 = iVar12 * 2;
      pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(long)iVar12);
      if (pxVar8 == (xmlChar *)0x0) {
        (*xmlFree)(pxVar7);
        pxVar4 = local_40;
        xmlErrMemory(local_40,(char *)0x0);
        pxVar4->instate = xVar2;
        return (xmlChar *)0x0;
      }
    }
    pxVar4 = local_40;
    if (iVar11 < 0x32) {
      iVar11 = iVar11 + 1;
    }
    else {
      if ((local_40->progressive == 0) &&
         ((long)local_40->input->end - (long)local_40->input->cur < 0xfa)) {
        xmlGROW(local_40);
      }
      iVar11 = 0;
      if (pxVar4->instate == XML_PARSER_EOF) {
        (*xmlFree)(pxVar8);
        return (xmlChar *)0x0;
      }
    }
    if (l == 1) {
      pxVar8[iVar9] = (xmlChar)uVar5;
      iVar9 = iVar9 + 1;
    }
    else {
      iVar6 = xmlCopyCharMultiByte(pxVar8 + iVar9,uVar5);
      iVar9 = iVar6 + iVar9;
    }
    pxVar4 = local_40;
    pxVar3 = local_40->input;
    if (*pxVar3->cur == '\n') {
      pxVar3->line = pxVar3->line + 1;
      pxVar3->col = 1;
    }
    else {
      pxVar3->col = pxVar3->col + 1;
    }
    pxVar3->cur = pxVar3->cur + l;
    uVar5 = xmlCurrentChar(local_40,&l);
    pxVar7 = pxVar8;
    if (uVar5 == 0) {
      if ((pxVar4->progressive == 0) &&
         ((0xf9 < (long)pxVar4->input->end - (long)pxVar4->input->cur ||
          (xmlGROW(pxVar4), pxVar4->progressive == 0)))) {
        pxVar3 = pxVar4->input;
        if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
           ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
          xmlSHRINK(pxVar4);
        }
      }
      uVar5 = xmlCurrentChar(pxVar4,&l);
    }
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
		ctxt->instate = (xmlParserInputState) state;
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}